

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O3

int doParseXmlDecl(_func_ENCODING_ptr_ENCODING_ptr_char_ptr_char_ptr *encodingFinder,
                  int isGeneralTextEntity,ENCODING *enc,char *ptr,char *end,char **badPtr,
                  char **versionPtr,char **versionEndPtr,char **encodingName,ENCODING **encoding,
                  int *standalone)

{
  char *pcVar1;
  int iVar2;
  ENCODING *pEVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *val;
  char *name;
  char *p;
  char local_79;
  char **local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  _func_ENCODING_ptr_ENCODING_ptr_char_ptr_char_ptr *local_38;
  
  local_58 = (char *)0x0;
  local_50 = (char *)0x0;
  local_60 = (char *)0x0;
  local_70 = ptr + (long)enc->minBytesPerChar * 5;
  local_68 = end + (long)enc->minBytesPerChar * -2;
  local_38 = encodingFinder;
  iVar2 = parsePseudoAttribute(enc,local_70,local_68,&local_50,&local_60,&local_58,&local_70);
  pcVar6 = local_50;
  pcVar5 = local_60;
  pcVar7 = local_70;
  badPtr = badPtr;
  if (iVar2 == 0 || local_50 == (char *)0x0) goto LAB_001536c0;
  iVar2 = (*enc->nameMatchesAscii)(enc,local_50,local_60,"version");
  if (iVar2 == 0) {
    pcVar7 = pcVar6;
    badPtr = badPtr;
    if (isGeneralTextEntity == 0) goto LAB_001536c0;
  }
  else {
    if (versionPtr != (char **)0x0) {
      *versionPtr = local_58;
    }
    if (versionEndPtr != (char **)0x0) {
      *versionEndPtr = local_70;
    }
    iVar2 = parsePseudoAttribute(enc,local_70,local_68,&local_50,&local_60,&local_58,&local_70);
    pcVar7 = local_70;
    badPtr = badPtr;
    if (iVar2 == 0) goto LAB_001536c0;
    pcVar5 = local_60;
    pcVar6 = local_50;
    if (local_50 == (char *)0x0) {
      badPtr = badPtr;
      if (isGeneralTextEntity == 0) {
        return 1;
      }
      goto LAB_001536c0;
    }
  }
  iVar2 = (*enc->nameMatchesAscii)(enc,pcVar6,pcVar5,"encoding");
  pcVar7 = local_58;
  if (iVar2 != 0) {
    local_40 = local_58;
    local_78 = badPtr;
    local_48 = &local_79;
    (*enc->utf8Convert)(enc,&local_40,local_68,&local_48,(char *)&local_78);
    pcVar5 = local_70;
    badPtr = local_78;
    if ((local_48 == &local_79) || (0x19 < ((int)local_79 & 0xffffffdfU) - 0x41)) goto LAB_001536c0;
    if (encodingName != (char **)0x0) {
      *encodingName = pcVar7;
    }
    if (encoding != (ENCODING **)0x0) {
      pEVar3 = (*local_38)(enc,pcVar7,local_70 + -(long)enc->minBytesPerChar);
      *encoding = pEVar3;
    }
    iVar2 = parsePseudoAttribute(enc,pcVar5,local_68,&local_50,&local_60,&local_58,&local_70);
    pcVar7 = local_70;
    badPtr = local_78;
    if (iVar2 == 0) goto LAB_001536c0;
    pcVar5 = local_60;
    pcVar6 = local_50;
    if (local_50 == (char *)0x0) {
      return 1;
    }
  }
  iVar2 = (*enc->nameMatchesAscii)(enc,pcVar6,pcVar5,"standalone");
  pcVar1 = local_58;
  pcVar5 = local_70;
  pcVar7 = pcVar6;
  if ((isGeneralTextEntity == 0) && (iVar2 != 0)) {
    iVar2 = (*enc->nameMatchesAscii)(enc,local_58,local_70 + -(long)enc->minBytesPerChar,"yes");
    if (iVar2 == 0) {
      iVar2 = (*enc->nameMatchesAscii)(enc,pcVar1,pcVar5 + -(long)enc->minBytesPerChar,"no");
      pcVar7 = pcVar1;
      if (iVar2 == 0) goto LAB_001536c0;
      iVar2 = 0;
    }
    else {
      iVar2 = 1;
    }
    if (standalone != (int *)0x0) {
      *standalone = iVar2;
    }
    local_78 = badPtr;
    while( true ) {
      local_48 = &local_79;
      local_40 = pcVar5;
      (*enc->utf8Convert)(enc,&local_40,local_68,&local_48,(char *)&local_78);
      uVar4 = (ulong)(uint)(int)local_79;
      if (local_48 == &local_79) {
        uVar4 = 0xffffffff;
      }
      if ((0x20 < (uint)uVar4) || ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0)) break;
      pcVar5 = pcVar5 + enc->minBytesPerChar;
    }
    pcVar7 = pcVar5;
    badPtr = local_78;
    if (pcVar5 == local_68) {
      return 1;
    }
  }
LAB_001536c0:
  *badPtr = pcVar7;
  return 0;
}

Assistant:

static
int doParseXmlDecl(const ENCODING *(*encodingFinder)(const ENCODING *,
                                                     const char *,
                                                     const char *),
                   int isGeneralTextEntity,
                   const ENCODING *enc,
                   const char *ptr,
                   const char *end,
                   const char **badPtr,
                   const char **versionPtr,
                   const char **versionEndPtr,
                   const char **encodingName,
                   const ENCODING **encoding,
                   int *standalone)
{
  const char *val = 0;
  const char *name = 0;
  const char *nameEnd = 0;
  ptr += 5 * enc->minBytesPerChar;
  end -= 2 * enc->minBytesPerChar;
  if (!parsePseudoAttribute(enc, ptr, end, &name, &nameEnd, &val, &ptr) || !name) {
    *badPtr = ptr;
    return 0;
  }
  if (!XmlNameMatchesAscii(enc, name, nameEnd, KW_version)) {
    if (!isGeneralTextEntity) {
      *badPtr = name;
      return 0;
    }
  }
  else {
    if (versionPtr)
      *versionPtr = val;
    if (versionEndPtr)
      *versionEndPtr = ptr;
    if (!parsePseudoAttribute(enc, ptr, end, &name, &nameEnd, &val, &ptr)) {
      *badPtr = ptr;
      return 0;
    }
    if (!name) {
      if (isGeneralTextEntity) {
        /* a TextDecl must have an EncodingDecl */
        *badPtr = ptr;
        return 0;
      }
      return 1;
    }
  }
  if (XmlNameMatchesAscii(enc, name, nameEnd, KW_encoding)) {
    int c = toAscii(enc, val, end);
    if (!(ASCII_a <= c && c <= ASCII_z) && !(ASCII_A <= c && c <= ASCII_Z)) {
      *badPtr = val;
      return 0;
    }
    if (encodingName)
      *encodingName = val;
    if (encoding)
      *encoding = encodingFinder(enc, val, ptr - enc->minBytesPerChar);
    if (!parsePseudoAttribute(enc, ptr, end, &name, &nameEnd, &val, &ptr)) {
      *badPtr = ptr;
      return 0;
    }
    if (!name)
      return 1;
  }
  if (!XmlNameMatchesAscii(enc, name, nameEnd, KW_standalone) || isGeneralTextEntity) {
    *badPtr = name;
    return 0;
  }
  if (XmlNameMatchesAscii(enc, val, ptr - enc->minBytesPerChar, KW_yes)) {
    if (standalone)
      *standalone = 1;
  }
  else if (XmlNameMatchesAscii(enc, val, ptr - enc->minBytesPerChar, KW_no)) {
    if (standalone)
      *standalone = 0;
  }
  else {
    *badPtr = val;
    return 0;
  }
  while (isSpace(toAscii(enc, ptr, end)))
    ptr += enc->minBytesPerChar;
  if (ptr != end) {
    *badPtr = ptr;
    return 0;
  }
  return 1;
}